

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Percentile.cpp
# Opt level: O2

void __thiscall Percentile::modelToQueries(Percentile *this)

{
  Query **ppQVar1;
  Aggregate *pAVar2;
  Query *pQVar3;
  size_t var;
  ulong __position;
  Aggregate *agg_1;
  Aggregate *agg;
  bitset<1500UL> local_f0;
  
  ppQVar1 = (Query **)operator_new__(0x328);
  this->varToQuery = ppQVar1;
  pAVar2 = (Aggregate *)operator_new(0x30);
  (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pAVar2->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar2->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar2->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  agg = pAVar2;
  memset(&local_f0,0,0xc0);
  std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
  emplace_back<std::bitset<1500ul>>
            ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar2,&local_f0);
  pQVar3 = (Query *)operator_new(0x30);
  (pQVar3->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (pQVar3->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pQVar3->_rootID =
       ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
       ->_id;
  std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back(&pQVar3->_aggregates,&agg);
  QueryCompiler::addQuery
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pQVar3);
  this->varToQuery[100] = pQVar3;
  for (__position = 0; __position != 100; __position = __position + 1) {
    if ((((this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[__position >> 6] >>
          (__position & 0x3f) & 1) != 0) &&
       (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w
         [__position >> 6] & 1L << ((byte)__position & 0x3f)) == 0)) {
      pAVar2 = (Aggregate *)operator_new(0x30);
      (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar2->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pAVar2->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar2->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar2->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      agg_1 = pAVar2;
      memset(&local_f0,0,0xc0);
      std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
      emplace_back<std::bitset<1500ul>>
                ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar2,&local_f0
                );
      pQVar3 = (Query *)operator_new(0x30);
      (pQVar3->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
      (pQVar3->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
      (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pQVar3->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pQVar3->_rootID = this->_queryRootIndex[__position];
      std::bitset<100UL>::set(&pQVar3->_fVars,__position,true);
      std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back(&pQVar3->_aggregates,&agg_1)
      ;
      QueryCompiler::addQuery
                ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pQVar3);
      this->varToQuery[__position] = pQVar3;
    }
  }
  return;
}

Assistant:

void Percentile::modelToQueries()
{
    varToQuery = new Query*[NUM_OF_VARIABLES+1];

    Aggregate* agg = new Aggregate();
    agg->_agg.push_back(prod_bitset());

    Query* count = new Query();
    count->_rootID = _td->_root->_id;
    count->_aggregates.push_back(agg);            
    _compiler->addQuery(count);

    varToQuery[NUM_OF_VARIABLES] = count;

    // Create a query & Aggregate
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_isFeature[var] && !_isCategoricalFeature[var])
        {
            Aggregate* agg = new Aggregate();
            agg->_agg.push_back(prod_bitset());

            Query* query = new Query();
            query->_rootID = _queryRootIndex[var];
            query->_fVars.set(var);
            query->_aggregates.push_back(agg);
            
            _compiler->addQuery(query);

            varToQuery[var] = query;
        }
    }
}